

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.h
# Opt level: O0

bool __thiscall tcmalloc::TrivialOnce::RunOnce<void(*)()>(TrivialOnce *this,_func_void *body)

{
  SpinLockHolder SVar1;
  SpinLock *l;
  SpinLockHolder local_70;
  SpinLockHolder h;
  atomic<int> *done_atomic;
  _func_void *body_local;
  TrivialOnce *this_local;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_2;
  
  h.lock_ = (SpinLock *)this;
  std::operator&(memory_order_acquire,__memory_order_mask);
  if (this->done_flag_ == 1) {
    this_local._3_1_ = false;
  }
  else {
    l = StaticStorage<SpinLock>::get(&this->lock_storage_);
    SpinLockHolder::SpinLockHolder(&local_70,l);
    SVar1 = h;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    this_local._3_1_ = ((SVar1.lock_)->lockword_).super___atomic_base<int>._M_i != 1;
    if (this_local._3_1_) {
      (*body)();
      SVar1 = h;
      std::operator&(memory_order_release,__memory_order_mask);
      ((SVar1.lock_)->lockword_).super___atomic_base<int>._M_i = 1;
    }
    SpinLockHolder::~SpinLockHolder(&local_70);
  }
  return this_local._3_1_;
}

Assistant:

bool RunOnce(Body body) {
    auto done_atomic = reinterpret_cast<std::atomic<int>*>(&done_flag_);
    if (done_atomic->load(std::memory_order_acquire) == 1) {
      return false;
    }

    SpinLockHolder h(lock_storage_.get());

    if (done_atomic->load(std::memory_order_relaxed) == 1) {
      // barrier provided by lock
      return false;
    }
    body();
    done_atomic->store(1, std::memory_order_release);
    return true;
  }